

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall libcellml::Parser::Parser(Parser *this)

{
  LoggerImpl *pLVar1;
  
  pLVar1 = (LoggerImpl *)operator_new(0x70);
  pLVar1[1].mErrors.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  pLVar1[1].mErrors.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pLVar1->mErrors).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pLVar1->mErrors).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pLVar1->mErrors).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pLVar1->mWarnings).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pLVar1->mWarnings).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pLVar1->mWarnings).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pLVar1->mMessages).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pLVar1->mMessages).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pLVar1->mMessages).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pLVar1->mIssues).
  super__Vector_base<std::shared_ptr<libcellml::Issue>,_std::allocator<std::shared_ptr<libcellml::Issue>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pLVar1->mIssues).
  super__Vector_base<std::shared_ptr<libcellml::Issue>,_std::allocator<std::shared_ptr<libcellml::Issue>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pLVar1->mIssues).
  super__Vector_base<std::shared_ptr<libcellml::Issue>,_std::allocator<std::shared_ptr<libcellml::Issue>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined1 *)
   ((long)&pLVar1[1].mErrors.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_finish + 1) = 1;
  Logger::Logger(&this->super_Logger,pLVar1);
  Strict::Strict(&this->super_Strict);
  (this->super_Logger)._vptr_Logger = (_func_int **)&PTR__Parser_002a0180;
  (this->super_Strict)._vptr_Strict = (_func_int **)&DAT_002a01a0;
  pLVar1 = Logger::pFunc(&this->super_Logger);
  pLVar1[1].mErrors.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)this;
  Strict::setStrict(&this->super_Strict,true);
  return;
}

Assistant:

Parser::Parser()
    : Logger(new ParserImpl())
{
    pFunc()->mParser = this;
    setStrict(true);
}